

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O0

void __thiscall
QStyledItemDelegate::setModelData
          (QStyledItemDelegate *this,QWidget *editor,QAbstractItemModel *model,QModelIndex *index)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  QItemEditorFactory *pQVar4;
  undefined8 in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  long in_FS_OFFSET;
  QStyledItemDelegatePrivate *d;
  QByteArray n;
  QByteArray *in_stack_ffffffffffffff18;
  QStyledItemDelegatePrivate *in_stack_ffffffffffffff20;
  undefined1 local_98 [56];
  QByteArray local_60;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QStyledItemDelegate *)0x85fe5a);
  local_60.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_60.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_60.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)*in_RSI)();
  QMetaObject::userProperty();
  pcVar3 = (char *)QMetaProperty::name();
  QByteArray::QByteArray(&local_60,pcVar3,-1);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x85fed1);
  if (bVar1) {
    pQVar4 = QStyledItemDelegatePrivate::editorFactory(in_stack_ffffffffffffff20);
    (**(code **)(*in_RDX + 0x90))(&local_28,in_RDX,in_RCX,2);
    uVar2 = ::QVariant::userType((QVariant *)0x85ff13);
    (*pQVar4->_vptr_QItemEditorFactory[3])(local_98,pQVar4,(ulong)uVar2);
    QByteArray::operator=((QByteArray *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    QByteArray::~QByteArray((QByteArray *)0x85ff41);
    ::QVariant::~QVariant(&local_28);
  }
  bVar1 = QByteArray::isEmpty((QByteArray *)0x85ff5b);
  if (!bVar1) {
    QByteArray::operator_cast_to_char_((QByteArray *)0x85ff8a);
    QObject::property((char *)&local_48);
    (**(code **)(*in_RDX + 0x98))(in_RDX,in_RCX,&local_48,2);
    ::QVariant::~QVariant(&local_48);
  }
  QByteArray::~QByteArray((QByteArray *)0x85ffd9);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStyledItemDelegate::setModelData(QWidget *editor,
                                 QAbstractItemModel *model,
                                 const QModelIndex &index) const
{
    Q_D(const QStyledItemDelegate);
    Q_ASSERT(model);
    Q_ASSERT(editor);
    QByteArray n = editor->metaObject()->userProperty().name();
    if (n.isEmpty())
        n = d->editorFactory()->valuePropertyName(
            model->data(index, Qt::EditRole).userType());
    if (!n.isEmpty())
        model->setData(index, editor->property(n), Qt::EditRole);
}